

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall
fasttext::Model::predict
          (Model *this,vector<int,_std::allocator<int>_> *input,int32_t k,real threshold,
          vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *heap,
          Vector *hidden,Vector *output)

{
  invalid_argument *this_00;
  
  if (k == -1) {
    k = this->osz_;
  }
  else if (k < 1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"k needs to be 1 or higher!");
    goto LAB_001295da;
  }
  if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->model
      == sup) {
    std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::reserve
              (heap,(long)(k + 1));
    computeHidden(this,input,hidden);
    if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->loss
        == hs) {
      dfs(this,k,threshold,this->osz_ * 2 + -2,0.0,heap,hidden);
    }
    else {
      findKBest(this,k,threshold,heap,hidden,output);
    }
    std::
    sort_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
              ((heap->
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start,
               (heap->
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish,comparePairs);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Model needs to be supervised for prediction!");
LAB_001295da:
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void Model::predict(
		const std::vector<int32_t>& input,
		int32_t k,
		real threshold,
		std::vector<std::pair<real, int32_t>>& heap,
		Vector& hidden,
		Vector& output) const {
	if (k == Model::kUnlimitedPredictions) {
		k = osz_;
	} else if (k <= 0) {
		throw std::invalid_argument("k needs to be 1 or higher!");
	}
	if (args_->model != model_name::sup) {
		throw std::invalid_argument("Model needs to be supervised for prediction!");
	}
	heap.reserve(k + 1);
	computeHidden(input, hidden);
	if (args_->loss == loss_name::hs) {
		dfs(k, threshold, 2 * osz_ - 2, 0.0, heap, hidden);
	} else {
		findKBest(k, threshold, heap, hidden, output);
	}
	std::sort_heap(heap.begin(), heap.end(), comparePairs);
}